

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O0

void __thiscall UnitTest_semantic10::UnitTest_semantic10(UnitTest_semantic10 *this)

{
  undefined8 *in_RDI;
  UnitTestBase *unaff_retaddr;
  
  UnitTestBase::UnitTestBase(unaff_retaddr);
  *in_RDI = &PTR_Run_002693c0;
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"semantic10");
  return;
}

Assistant:

TEST_CASE(semantic10)
{
    EXPECT_TRUE(Semantic("a = 1 > 2"));
    EXPECT_TRUE(Semantic("a = 'str' >= 'str'"));
    EXPECT_TRUE(Semantic("a = 1 > b"));
    EXPECT_EXCEPTION(luna::SemanticException, {
        Semantic("a = 1 < 'str'");
    });
    EXPECT_EXCEPTION(luna::SemanticException, {
        Semantic("a = true <= false");
    });
}